

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

QString * __thiscall
QLocale::name(QString *__return_storage_ptr__,QLocale *this,TagSeparator separator)

{
  ushort uVar1;
  QLocalePrivate *pQVar2;
  QLocaleData *pQVar3;
  long lVar4;
  DataPointer *pDVar5;
  undefined1 auVar6 [8];
  char16_t *pcVar7;
  array<char,_4UL> aVar8;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QLatin1String local_58;
  undefined1 local_48 [8];
  char16_t *pcStack_40;
  long local_38;
  uchar *local_30;
  _Type local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((char)separator < '\0') {
    badSeparatorWarning("name",separator);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_0030f36f;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    local_24[0] = -0x56;
    local_24[1] = -0x56;
    local_24[2] = -0x56;
    local_24[3] = -0x56;
    aVar8 = QLocalePrivate::languageToCode
                      (((this->d).d.ptr)->m_data->m_language_id,(LanguageCodeTypes)0xffffffff);
    local_24[0] = aVar8._M_elems[0];
    local_24[1] = aVar8._M_elems[1];
    local_24[2] = aVar8._M_elems[2];
    local_24[3] = aVar8._M_elems[3];
    local_58.m_size = -1;
    do {
      pDVar5 = &((QString *)local_58.m_size)->d;
      local_58.m_size = (long)&(((QString *)local_58.m_size)->d).d + 1;
    } while ((local_24 + 1)[(long)&pDVar5->d] != '\0');
    local_58.m_data = local_24;
    pQVar2 = (this->d).d.ptr;
    pQVar3 = pQVar2->m_data;
    if ((pQVar3->m_language_id == 1) || (pQVar3->m_territory_id == 0)) {
      ba.m_data = (storage_type *)pQVar3;
      ba.m_size = (qsizetype)local_24;
      QString::fromLatin1((QString *)local_48,(QString *)local_58.m_size,ba);
      lVar4 = local_38;
      pcVar7 = pcStack_40;
      auVar6 = local_48;
      local_48 = (undefined1  [8])0x0;
      pcStack_40 = (char16_t *)0x0;
      (__return_storage_ptr__->d).d = (Data *)auVar6;
      (__return_storage_ptr__->d).ptr = pcVar7;
      local_38 = 0;
      (__return_storage_ptr__->d).size = lVar4;
    }
    else {
      uVar1 = pQVar2->m_data->m_territory_id;
      local_38 = 0;
      local_30 = (uchar *)0x0;
      if (0xfefa < (ushort)(uVar1 - 0x106)) {
        lVar4 = (ulong)uVar1 * 3;
        local_30 = "ZZ" + lVar4;
        local_38 = 3 - (ulong)("ZZ"[lVar4 + 2] == '\0');
      }
      pcStack_40 = (char16_t *)CONCAT71(pcStack_40._1_7_,separator);
      local_48 = (undefined1  [8])&local_58;
      QStringBuilder<QStringBuilder<QLatin1String_&,_QLatin1Char>,_QLatin1String>::
      convertTo<QString>(__return_storage_ptr__,
                         (QStringBuilder<QStringBuilder<QLatin1String_&,_QLatin1Char>,_QLatin1String>
                          *)local_48);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
LAB_0030f36f:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QLocale::name(TagSeparator separator) const
{
    const char sep = char(separator);
    if (uchar(sep) > 0x7f) {
        badSeparatorWarning("name", sep);
        return {};
    }
    const auto code = d->languageCode();
    QLatin1StringView view{code.data()};

    Language l = language();
    if (l == C)
        return view;

    Territory c = territory();
    if (c == AnyTerritory)
        return view;

    return view + QLatin1Char(sep) + d->territoryCode();
}